

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::TypenameFunction::eval
          (TypenameFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  TypePrinter *in_RDI;
  Type *in_stack_00000008;
  TypePrinter *in_stack_00000010;
  TypePrinter printer;
  string *in_stack_ffffffffffffff58;
  ConstantValue *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  TypePrinter *this_01;
  Expression *in_stack_ffffffffffffff98;
  EvalContext *in_stack_ffffffffffffffa0;
  SystemSubroutine *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [2];
  
  this_01 = in_RDI;
  local_48[0].field_2._8_8_ = in_RCX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  bVar1 = SystemSubroutine::noHierarchical
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    this_00 = local_48;
    TypePrinter::TypePrinter((TypePrinter *)this_00);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               local_48[0].field_2._8_8_,0);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xb0edc3);
    TypePrinter::append(in_stack_00000010,in_stack_00000008);
    TypePrinter::toString_abi_cxx11_(this_01);
    slang::ConstantValue::ConstantValue((ConstantValue *)this_00,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(this_00);
    TypePrinter::~TypePrinter((TypePrinter *)0xb0ee08);
  }
  else {
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        if (!noHierarchical(context, *args[0]))
            return nullptr;

        TypePrinter printer;
        printer.append(*args[0]->type);

        return printer.toString();
    }